

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O1

void ZSTD_buildFSETable(ZSTD_seqSymbol *dt,short *normalizedCounter,uint maxSymbolValue,
                       U32 *baseValue,U32 *nbAdditionalBits,uint tableLog,void *wksp,size_t wkspSize
                       ,int bmi2)

{
  ushort uVar1;
  short sVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  byte bVar6;
  long lVar7;
  uint uVar8;
  undefined4 uVar9;
  U32 tableMask;
  uint uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  size_t u;
  ulong uVar16;
  long lVar17;
  int iVar18;
  
  bVar5 = (byte)tableLog;
  uVar3 = 1 << (bVar5 & 0x1f);
  uVar9 = 1;
  uVar10 = uVar3 - 1;
  uVar8 = maxSymbolValue + 1;
  uVar14 = uVar10;
  if (uVar8 != 0) {
    uVar16 = 0;
    uVar9 = 1;
    do {
      sVar2 = normalizedCounter[uVar16];
      if (sVar2 == -1) {
        uVar4 = (ulong)uVar14;
        uVar14 = uVar14 - 1;
        dt[uVar4 + 1].baseValue = (U32)uVar16;
        sVar2 = 1;
      }
      else if ((0x10000 << (bVar5 - 1 & 0x1f)) >> 0x10 <= (int)sVar2) {
        uVar9 = 0;
      }
      *(short *)((long)wksp + uVar16 * 2) = sVar2;
      uVar16 = uVar16 + 1;
    } while (uVar8 != uVar16);
  }
  dt->nextState = (short)uVar9;
  dt->nbAdditionalBits = (char)((uint)uVar9 >> 0x10);
  dt->nbBits = (char)((uint)uVar9 >> 0x18);
  dt->baseValue = tableLog;
  if (uVar14 == uVar10) {
    lVar7 = (long)wksp + 0x6a;
    iVar18 = (uVar3 >> 3) + (uVar3 >> 1) + 3;
    if (uVar8 != 0) {
      uVar16 = 0;
      lVar11 = 0;
      lVar17 = 0;
      do {
        uVar4 = (ulong)normalizedCounter[uVar16];
        *(long *)(lVar7 + lVar11) = lVar17;
        if (8 < (long)uVar4) {
          lVar12 = 0x72;
          do {
            *(long *)((long)wksp + lVar12 + lVar11) = lVar17;
            uVar13 = lVar12 - 0x62;
            lVar12 = lVar12 + 8;
          } while (uVar13 < uVar4);
        }
        lVar11 = lVar11 + uVar4;
        uVar16 = uVar16 + 1;
        lVar17 = lVar17 + 0x101010101010101;
      } while (uVar16 != uVar8);
    }
    uVar16 = 0;
    uVar14 = 0;
    do {
      lVar11 = 0;
      uVar8 = uVar14;
      do {
        dt[(ulong)(uVar8 & uVar10) + 1].baseValue = (uint)*(byte *)(lVar7 + lVar11);
        lVar11 = lVar11 + 1;
        uVar8 = uVar8 + iVar18;
      } while (lVar11 == 1);
      uVar14 = uVar14 + iVar18 * 2 & uVar10;
      uVar16 = uVar16 + 2;
      lVar7 = lVar7 + 2;
    } while (uVar16 < uVar3);
  }
  else if (uVar8 != 0) {
    uVar4 = 0;
    uVar16 = 0;
    do {
      sVar2 = normalizedCounter[uVar4];
      if (0 < sVar2) {
        iVar18 = 0;
        do {
          dt[uVar16 + 1].baseValue = (U32)uVar4;
          do {
            uVar15 = (int)uVar16 + (uVar3 >> 3) + (uVar3 >> 1) + 3 & uVar10;
            uVar16 = (ulong)uVar15;
          } while (uVar14 < uVar15);
          iVar18 = iVar18 + 1;
        } while (iVar18 != sVar2);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar8);
  }
  uVar16 = 0;
  do {
    uVar4 = (ulong)dt[uVar16 + 1].baseValue;
    uVar1 = *(ushort *)((long)wksp + uVar4 * 2);
    *(ushort *)((long)wksp + uVar4 * 2) = uVar1 + 1;
    iVar18 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> iVar18 == 0; iVar18 = iVar18 + -1) {
      }
    }
    bVar6 = bVar5 - (char)iVar18;
    dt[uVar16 + 1].nbBits = bVar6;
    dt[uVar16 + 1].nextState = (uVar1 << (bVar6 & 0x1f)) - (short)uVar3;
    dt[uVar16 + 1].nbAdditionalBits = (BYTE)nbAdditionalBits[uVar4];
    dt[uVar16 + 1].baseValue = baseValue[uVar4];
    uVar16 = uVar16 + 1;
  } while (uVar3 != uVar16);
  return;
}

Assistant:

void ZSTD_buildFSETable(ZSTD_seqSymbol* dt,
            const short* normalizedCounter, unsigned maxSymbolValue,
            const U32* baseValue, const U32* nbAdditionalBits,
            unsigned tableLog, void* wksp, size_t wkspSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        ZSTD_buildFSETable_body_bmi2(dt, normalizedCounter, maxSymbolValue,
                baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
        return;
    }
#endif
    (void)bmi2;
    ZSTD_buildFSETable_body_default(dt, normalizedCounter, maxSymbolValue,
            baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
}